

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void pqdownheap(deflate_state *s,ct_data *tree,int k)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  iVar1 = s->heap[(uint)k];
  uVar3 = k * 2;
  iVar4 = s->heap_len;
  if ((int)uVar3 <= iVar4) {
    do {
      uVar2 = uVar3;
      if ((int)uVar3 < iVar4) {
        if ((tree[s->heap[(int)(uVar3 | 1)]].fc.freq < tree[s->heap[(int)uVar3]].fc.freq) ||
           ((tree[s->heap[(int)(uVar3 | 1)]].fc.freq == tree[s->heap[(int)uVar3]].fc.freq &&
            (s->depth[s->heap[(int)(uVar3 | 1)]] <= s->depth[s->heap[(int)uVar3]])))) {
          uVar2 = uVar3 | 1;
        }
      }
      iVar4 = s->heap[(int)uVar2];
      if ((tree[iVar1].fc.freq < tree[iVar4].fc.freq) ||
         ((tree[iVar1].fc.freq == tree[iVar4].fc.freq && (s->depth[iVar1] <= s->depth[iVar4]))))
      break;
      s->heap[k] = iVar4;
      uVar3 = uVar2 * 2;
      iVar4 = s->heap_len;
      k = uVar2;
    } while ((int)uVar3 <= iVar4);
  }
  s->heap[k] = iVar1;
  return;
}

Assistant:

local void pqdownheap(s, tree, k)
    deflate_state *s;
    ct_data *tree;  /* the tree to restore */
    int k;               /* node to move down */
{
    int v = s->heap[k];
    int j = k << 1;  /* left son of k */
    while (j <= s->heap_len) {
        /* Set j to the smallest of the two sons: */
        if (j < s->heap_len &&
            smaller(tree, s->heap[j+1], s->heap[j], s->depth)) {
            j++;
        }
        /* Exit if v is smaller than both sons */
        if (smaller(tree, v, s->heap[j], s->depth)) break;

        /* Exchange v with the smallest son */
        s->heap[k] = s->heap[j];  k = j;

        /* And continue down the tree, setting j to the left son of k */
        j <<= 1;
    }
    s->heap[k] = v;
}